

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall deqp::egl::Image::ModifyTests::addModifyActions(ModifyTests *this)

{
  ModifyRenderbufferClearColor *this_00;
  LabeledActions *this_01;
  allocator<char> local_c9;
  string local_c8;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_a8;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_98;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_88;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_78;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_68;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_58;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_48;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_38;
  Vec4 local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"tex_subimage_rgb8",&local_c9);
  local_38.m_data.ptr = (Action *)operator_new(0x10);
  this_01 = &this->m_modifyActions;
  (local_38.m_data.ptr)->_vptr_Action = (_func_int **)&PTR__Action_01e085c8;
  local_38.m_data.ptr[1]._vptr_Action = (_func_int **)0x140100001907;
  LabeledActions::add(this_01,&local_c8,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_38);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_38);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"tex_subimage_rgb565",&local_c9);
  local_48.m_data.ptr = (Action *)operator_new(0x10);
  (local_48.m_data.ptr)->_vptr_Action = (_func_int **)&PTR__Action_01e085c8;
  local_48.m_data.ptr[1]._vptr_Action = (_func_int **)0x836300001907;
  LabeledActions::add(this_01,&local_c8,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_48);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_48);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"tex_subimage_rgba8",&local_c9);
  local_58.m_data.ptr = (Action *)operator_new(0x10);
  (local_58.m_data.ptr)->_vptr_Action = (_func_int **)&PTR__Action_01e085c8;
  local_58.m_data.ptr[1]._vptr_Action = (_func_int **)0x140100001908;
  LabeledActions::add(this_01,&local_c8,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_58);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_58);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"tex_subimage_rgb5_a1",&local_c9);
  local_68.m_data.ptr = (Action *)operator_new(0x10);
  (local_68.m_data.ptr)->_vptr_Action = (_func_int **)&PTR__Action_01e085c8;
  local_68.m_data.ptr[1]._vptr_Action = (_func_int **)0x803400001908;
  LabeledActions::add(this_01,&local_c8,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_68);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_68);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"tex_subimage_rgba4",&local_c9);
  local_78.m_data.ptr = (Action *)operator_new(0x10);
  (local_78.m_data.ptr)->_vptr_Action = (_func_int **)&PTR__Action_01e085c8;
  local_78.m_data.ptr[1]._vptr_Action = (_func_int **)0x803300001908;
  LabeledActions::add(this_01,&local_c8,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_78);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_78);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"renderbuffer_clear_color",&local_c9);
  this_00 = (ModifyRenderbufferClearColor *)operator_new(0x18);
  local_28.m_data[0] = 0.3;
  local_28.m_data[1] = 0.5;
  local_28.m_data[2] = 0.3;
  local_28.m_data[3] = 1.0;
  GLES2ImageApi::ModifyRenderbufferClearColor::ModifyRenderbufferClearColor(this_00,&local_28);
  local_88.m_data.ptr = (Action *)this_00;
  LabeledActions::add(this_01,&local_c8,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_88);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"renderbuffer_clear_depth",&local_c9);
  local_98.m_data.ptr = (Action *)operator_new(0x10);
  (local_98.m_data.ptr)->_vptr_Action = (_func_int **)&PTR__Action_01e08680;
  *(undefined4 *)&local_98.m_data.ptr[1]._vptr_Action = 0x3f333333;
  LabeledActions::add(this_01,&local_c8,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_98);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_98);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"renderbuffer_clear_stencil",&local_c9);
  local_a8.m_data.ptr = (Action *)operator_new(0x10);
  (local_a8.m_data.ptr)->_vptr_Action = (_func_int **)&PTR__Action_01e086c0;
  *(undefined4 *)&local_a8.m_data.ptr[1]._vptr_Action = 0x4e;
  LabeledActions::add(this_01,&local_c8,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_a8);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void ModifyTests::addModifyActions (void)
{
	m_modifyActions.add("tex_subimage_rgb8",			MovePtr<Action>(new GLES2ImageApi::ModifyTexSubImage(GL_RGB,	GL_UNSIGNED_BYTE)));
	m_modifyActions.add("tex_subimage_rgb565",			MovePtr<Action>(new GLES2ImageApi::ModifyTexSubImage(GL_RGB,	GL_UNSIGNED_SHORT_5_6_5)));
	m_modifyActions.add("tex_subimage_rgba8",			MovePtr<Action>(new GLES2ImageApi::ModifyTexSubImage(GL_RGBA,	GL_UNSIGNED_BYTE)));
	m_modifyActions.add("tex_subimage_rgb5_a1",			MovePtr<Action>(new GLES2ImageApi::ModifyTexSubImage(GL_RGBA,	GL_UNSIGNED_SHORT_5_5_5_1)));
	m_modifyActions.add("tex_subimage_rgba4",			MovePtr<Action>(new GLES2ImageApi::ModifyTexSubImage(GL_RGBA,	GL_UNSIGNED_SHORT_4_4_4_4)));

	m_modifyActions.add("renderbuffer_clear_color",		MovePtr<Action>(new GLES2ImageApi::ModifyRenderbufferClearColor(tcu::Vec4(0.3f, 0.5f, 0.3f, 1.0f))));
	m_modifyActions.add("renderbuffer_clear_depth",		MovePtr<Action>(new GLES2ImageApi::ModifyRenderbufferClearDepth(0.7f)));
	m_modifyActions.add("renderbuffer_clear_stencil",	MovePtr<Action>(new GLES2ImageApi::ModifyRenderbufferClearStencil(78)));
}